

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svglayoutstate.cpp
# Opt level: O0

FillRule lunasvg::parseFillRule(string_view *input)

{
  FillRule FVar1;
  string_view *input_local;
  
  FVar1 = parseEnumValue<lunasvg::FillRule,2u>(input,&parseFillRule::entries,NonZero);
  return FVar1;
}

Assistant:

static FillRule parseFillRule(const std::string_view& input)
{
    static const SVGEnumerationEntry<FillRule> entries[] = {
        {FillRule::NonZero, "nonzero"},
        {FillRule::EvenOdd, "evenodd"}
    };

    return parseEnumValue(input, entries, FillRule::NonZero);
}